

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx.h
# Opt level: O2

int glad_glx_has_extension(Display *display,int screen,char *ext)

{
  byte *__haystack;
  byte *pbVar1;
  size_t sVar2;
  byte *pbVar3;
  int iVar4;
  
  iVar4 = 0;
  if ((sf_glad_glXQueryExtensionsString != (PFNGLXQUERYEXTENSIONSSTRINGPROC)0x0) &&
     (__haystack = (byte *)(*sf_glad_glXQueryExtensionsString)(display,screen),
     ext != (char *)0x0 && __haystack != (byte *)0x0)) {
    do {
      pbVar1 = (byte *)strstr((char *)__haystack,ext);
      if (pbVar1 == (byte *)0x0) {
        return 0;
      }
      sVar2 = strlen(ext);
      pbVar3 = pbVar1 + sVar2;
    } while (((pbVar1 != __haystack) && (__haystack = pbVar3, pbVar1[-1] != 0x20)) ||
            (__haystack = pbVar3, (*pbVar3 & 0xdf) != 0));
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int glad_glx_has_extension(Display *display, int screen, const char *ext) {
#ifndef GLX_VERSION_1_1
    (void) display;
    (void) screen;
    (void) ext;
#else
    const char *terminator;
    const char *loc;
    const char *extensions;

    if (glXQueryExtensionsString == NULL) {
        return 0;
    }

    extensions = glXQueryExtensionsString(display, screen);

    if(extensions == NULL || ext == NULL) {
        return 0;
    }

    while(1) {
        loc = strstr(extensions, ext);
        if(loc == NULL)
            break;

        terminator = loc + strlen(ext);
        if((loc == extensions || *(loc - 1) == ' ') &&
            (*terminator == ' ' || *terminator == '\0')) {
            return 1;
        }
        extensions = terminator;
    }
#endif

    return 0;
}